

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_compress.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  string local_a8 [8];
  string mzp_out;
  string local_78 [8];
  string entry_data;
  int local_54;
  undefined1 local_50 [4];
  int i;
  Mzp mzp;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  if (argc < 3) {
    fprintf(_stderr,"%s output input [input..]\n",*argv);
    argv_local._4_4_ = -1;
  }
  else {
    mg::data::Mzp::Mzp((Mzp *)local_50);
    for (local_54 = 2; local_54 < argc; local_54 = local_54 + 1) {
      std::__cxx11::string::string(local_78);
      bVar1 = mg::fs::read_file(*(char **)(mzp.entry_data.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                          (long)local_54 * 8),(string *)local_78);
      if (bVar1) {
        fprintf(_stderr,"Adding file %s\n",
                *(undefined8 *)
                 (mzp.entry_data.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)local_54 * 8));
        std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ::emplace_back<>((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          *)&mzp);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      }
      else {
        argv_local._4_4_ = -1;
      }
      std::__cxx11::string::~string(local_78);
      if (!bVar1) goto LAB_00108735;
    }
    std::__cxx11::string::string(local_a8);
    mg::data::mzp_write((Mzp *)local_50,(string *)local_a8);
    bVar1 = mg::fs::write_file(*(char **)(mzp.entry_data.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),
                               (string *)local_a8);
    __stream = _stderr;
    if (bVar1) {
      uVar2 = std::__cxx11::string::size();
      fprintf(__stream,"Wrote %ld bytes to %s\n",uVar2,
              *(undefined8 *)
               (mzp.entry_data.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 8));
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = -1;
    }
    std::__cxx11::string::~string(local_a8);
LAB_00108735:
    mg::data::Mzp::~Mzp((Mzp *)local_50);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    fprintf(stderr, "%s output input [input..]\n", argv[0]);
    return -1;
  }

  // Constrct new MZP
  mg::data::Mzp mzp;

  // Read each input file as a new MZP record
  for (int i = 2; i < argc; i++) {
    std::string entry_data;
    if (!mg::fs::read_file(argv[i], entry_data)) {
      return -1;
    }

    fprintf(stderr, "Adding file %s\n", argv[i]);
    mzp.entry_headers.emplace_back();
    mzp.entry_data.emplace_back(entry_data);
  }

  // Write out the archive
  std::string mzp_out;
  mg::data::mzp_write(mzp, mzp_out);
  if (!mg::fs::write_file(argv[1], mzp_out)) {
    return -1;
  }
  fprintf(stderr, "Wrote %ld bytes to %s\n", mzp_out.size(), argv[1]);

  return 0;
}